

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixFile_Open(char *zPath,int iOpenMode,jx9_value *pResource,void **ppHandle)

{
  int iVar1;
  undefined4 local_34;
  int fd;
  int iOpen;
  void **ppHandle_local;
  jx9_value *pResource_local;
  int iOpenMode_local;
  char *zPath_local;
  
  local_34 = 0;
  if ((iOpenMode & 8U) == 0) {
    if ((iOpenMode & 0x40U) == 0) {
      if ((iOpenMode & 0x10U) != 0) {
        local_34 = 0x202;
      }
    }
    else {
      local_34 = 0xc0;
    }
  }
  else {
    local_34 = 0x40;
    if ((iOpenMode & 0x10U) != 0) {
      local_34 = 0x240;
    }
  }
  if ((iOpenMode & 4U) == 0) {
    if ((iOpenMode & 2U) != 0) {
      local_34 = local_34 | 1;
    }
  }
  else {
    local_34 = local_34 | 2;
  }
  if ((iOpenMode & 0x20U) != 0) {
    local_34 = local_34 | 0x400;
  }
  iVar1 = open(zPath,local_34,0x1a0);
  if (iVar1 < 0) {
    zPath_local._4_4_ = -1;
  }
  else {
    *ppHandle = (void *)(long)iVar1;
    zPath_local._4_4_ = 0;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixFile_Open(const char *zPath, int iOpenMode, jx9_value *pResource, void **ppHandle)
{
	int iOpen = O_RDONLY;
	int fd;
	/* Set the desired flags according to the open mode */
	if( iOpenMode & JX9_IO_OPEN_CREATE ){
		/* Open existing file, or create if it doesn't exist */
		iOpen = O_CREAT;
		if( iOpenMode & JX9_IO_OPEN_TRUNC ){
			/* If the specified file exists and is writable, the function overwrites the file */
			iOpen |= O_TRUNC;
			SXUNUSED(pResource); /* cc warning */
		}
	}else if( iOpenMode & JX9_IO_OPEN_EXCL ){
		/* Creates a new file, only if it does not already exist.
		* If the file exists, it fails.
		*/
		iOpen = O_CREAT|O_EXCL;
	}else if( iOpenMode & JX9_IO_OPEN_TRUNC ){
		/* Opens a file and truncates it so that its size is zero bytes
		 * The file must exist.
		 */
		iOpen = O_RDWR|O_TRUNC;
	}
	if( iOpenMode & JX9_IO_OPEN_RDWR ){
		/* Read+Write access */
		iOpen &= ~O_RDONLY;
		iOpen |= O_RDWR;
	}else if( iOpenMode & JX9_IO_OPEN_WRONLY ){
		/* Write only access */
		iOpen &= ~O_RDONLY;
		iOpen |= O_WRONLY;
	}
	if( iOpenMode & JX9_IO_OPEN_APPEND ){
		/* Append mode */
		iOpen |= O_APPEND;
	}
#ifdef O_TEMP
	if( iOpenMode & JX9_IO_OPEN_TEMP ){
		/* File is temporary */
		iOpen |= O_TEMP;
	}
#endif
	/* Open the file now */
	fd = open(zPath, iOpen, JX9_UNIX_OPEN_MODE);
	if( fd < 0 ){
		/* IO error */
		return -1;
	}
	/* Save the handle */
	*ppHandle = SX_INT_TO_PTR(fd);
	return JX9_OK;
}